

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderClearCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *in_RSI;
  Printer *in_RDI;
  ImmutableMessageFieldGenerator *unaff_retaddr;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  Printer *printer_00;
  
  printer_00 = in_RDI;
  FieldDescriptor::file((FieldDescriptor *)in_RDI->output_);
  bVar1 = SupportFieldPresence((FileDescriptor *)0x58e908);
  if (bVar1) {
    PrintNestedBuilderCondition(unaff_retaddr,printer_00,in_RSI,&in_RDI->variable_delimiter_);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  else {
    PrintNestedBuilderCondition(unaff_retaddr,printer_00,in_RSI,&in_RDI->variable_delimiter_);
  }
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuilderClearCode(
    io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    PrintNestedBuilderCondition(printer, "$name$_ = null;\n",

                                "$name$Builder_.clear();\n");
    printer->Print(variables_, "$clear_has_field_bit_builder$\n");
  } else {
    PrintNestedBuilderCondition(printer, "$name$_ = null;\n",

                                "$name$_ = null;\n"
                                "$name$Builder_ = null;\n");
  }
}